

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stair_shuffle.c
# Opt level: O0

void clear_all_flags(void)

{
  dungeon_map *local_10;
  dungeon_map *map;
  
  for (local_10 = maps; local_10->index != '\0'; local_10 = local_10 + 1) {
    clear_flags(local_10);
  }
  return;
}

Assistant:

static void clear_all_flags()
{
    dungeon_map *map;
    for (map = maps; map->index; map++) {
        clear_flags(map);
    }
}